

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

void convert_sinsn(iasctx *ctx,easm_sinsn *sinsn)

{
  int iVar1;
  litem *plVar2;
  litem **pplVar3;
  litem *li;
  int i;
  easm_sinsn *sinsn_local;
  iasctx *ctx_local;
  
  plVar2 = (litem *)calloc(0x20,1);
  plVar2->type = LITEM_NAME;
  plVar2->str = sinsn->str;
  if (ctx->atomsmax <= ctx->atomsnum) {
    if (ctx->atomsmax == 0) {
      ctx->atomsmax = 0x10;
    }
    else {
      ctx->atomsmax = ctx->atomsmax << 1;
    }
    pplVar3 = (litem **)realloc(ctx->atoms,(long)ctx->atomsmax << 3);
    ctx->atoms = pplVar3;
  }
  iVar1 = ctx->atomsnum;
  ctx->atomsnum = iVar1 + 1;
  ctx->atoms[iVar1] = plVar2;
  for (li._4_4_ = 0; li._4_4_ < sinsn->operandsnum; li._4_4_ = li._4_4_ + 1) {
    convert_operand(ctx,sinsn->operands[li._4_4_]);
  }
  convert_mods(ctx,sinsn->mods);
  return;
}

Assistant:

void convert_sinsn(struct iasctx *ctx, struct easm_sinsn *sinsn) {
	int i;
	struct litem *li = calloc(sizeof *li, 1);
	li->type = LITEM_NAME;
	li->str = sinsn->str;
	ADDARRAY(ctx->atoms, li);
	for (i = 0; i < sinsn->operandsnum; i++) {
		convert_operand(ctx, sinsn->operands[i]);
	}
	convert_mods(ctx, sinsn->mods);
}